

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O1

void __thiscall
soul::SourceCodeOperations::replaceText
          (SourceCodeOperations *this,CodeLocation *start,CodeLocation *end,string *newText)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t sVar3;
  size_t sVar4;
  TextModificationOp local_50;
  
  sVar3 = CodeLocation::getByteOffsetInFile(start);
  sVar4 = CodeLocation::getByteOffsetInFile(end);
  local_50.length = sVar4 - sVar3;
  if (sVar4 < sVar3) {
    throwInternalCompilerError("e >= s","replaceText",0x8f);
  }
  if ((this->applyModification).super__Function_base._M_manager != (_Manager_type)0x0) {
    paVar2 = &local_50.insertedText.field_2;
    local_50.insertedText._M_dataplus._M_p = (newText->_M_dataplus)._M_p;
    paVar1 = &newText->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.insertedText._M_dataplus._M_p == paVar1) {
      local_50.insertedText.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_50.insertedText.field_2._8_4_ = *(undefined4 *)((long)&newText->field_2 + 8);
      local_50.insertedText.field_2._12_4_ = *(undefined4 *)((long)&newText->field_2 + 0xc);
      local_50.insertedText._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_50.insertedText.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_50.insertedText._M_string_length = newText->_M_string_length;
    (newText->_M_dataplus)._M_p = (pointer)paVar1;
    newText->_M_string_length = 0;
    (newText->field_2)._M_local_buf[0] = '\0';
    local_50.startOffset = sVar3;
    if ((this->applyModification).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->applyModification)._M_invoker)((_Any_data *)&this->applyModification,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.insertedText._M_dataplus._M_p != paVar2) {
        operator_delete(local_50.insertedText._M_dataplus._M_p,
                        local_50.insertedText.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    std::__throw_bad_function_call();
  }
  throwInternalCompilerError("applyModification != nullptr","replaceText",0x90);
}

Assistant:

void SourceCodeOperations::replaceText (CodeLocation start, CodeLocation end, std::string newText)
{
    auto s = start.getByteOffsetInFile();
    auto e = end.getByteOffsetInFile();
    SOUL_ASSERT (e >= s);
    SOUL_ASSERT (applyModification != nullptr);
    applyModification ({ s, e - s, std::move (newText) });
}